

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O1

void __thiscall Experiments::InitBuffer(Experiments *this,int count)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (this->buffer != (uint *)0x0) {
    operator_delete__(this->buffer);
  }
  uVar3 = 0xffffffffffffffff;
  if (-1 < count) {
    uVar3 = (long)count * 4;
  }
  puVar2 = (uint *)operator_new__(uVar3);
  this->buffer = puVar2;
  if (count != 0) {
    uVar3 = 0;
    do {
      iVar1 = rand();
      this->buffer[uVar3] = iVar1 % count;
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
  }
  return;
}

Assistant:

void Experiments::InitBuffer(int count) {
    if (buffer != nullptr)
        delete[] buffer;
    buffer = new unsigned int[count];
    for (unsigned int i = 0; i < (unsigned int)count; i++)
        buffer[i] = rand() % count;
}